

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O0

bool ON_RemoveBezierSingAt1(int dim,int order,int cv_stride,double *cv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int local_34;
  int CVlen;
  int ord0;
  int k;
  int i;
  int cvdim;
  double *cv_local;
  int cv_stride_local;
  int order_local;
  int dim_local;
  
  iVar2 = dim + 1;
  local_34 = order * iVar2;
  cv_local._4_4_ = order;
  do {
    bVar1 = false;
    if (1 < cv_local._4_4_) {
      bVar1 = cv[local_34 + -1] == 0.0;
    }
    if (!bVar1) {
      while (cv_local._4_4_ < order) {
        ON_IncreaseBezierDegree(dim,true,cv_local._4_4_,cv_stride,cv);
        cv_local._4_4_ = cv_local._4_4_ + 1;
      }
      return false;
    }
    cv_local._4_4_ = cv_local._4_4_ + -1;
    ord0 = dim;
    if (cv_local._4_4_ < 2) {
      return false;
    }
    while (iVar3 = ord0 + -1, ord0 != 0) {
      if (cv[(local_34 + -1) - iVar3] != 0.0) {
        return false;
      }
      ord0 = iVar3;
      if (NAN(cv[(local_34 + -1) - iVar3])) {
        return false;
      }
    }
    for (ord0 = 0; ord0 < cv_local._4_4_; ord0 = ord0 + 1) {
      for (CVlen = 0; CVlen < iVar2; CVlen = CVlen + 1) {
        cv[ord0 * cv_stride + CVlen] =
             ((double)cv_local._4_4_ * cv[ord0 * cv_stride + CVlen]) /
             (double)(cv_local._4_4_ - ord0);
      }
    }
    local_34 = local_34 - iVar2;
  } while( true );
}

Assistant:

bool ON_RemoveBezierSingAt1(
                  int dim, 
                  int order, 
                  int cv_stride,
                  double* cv
                  )
{
  const int cvdim = dim+1;
  int i,k,ord0,CVlen;
  ord0 = order;
  CVlen=order*cvdim;
  while (order > 1 && cv[CVlen-1] == 0.0) {
    order--;
    if (order < 2)
      return false;
    i = dim; 
    while(i--) {
      if (cv[CVlen-1-i] != 0.0)
        return false;
    }
    for (i=0;  i<order;  i++) {
      for (k=0;  k<cvdim;  k++) 
        cv[i*cv_stride+k] = (order*cv[i*cv_stride+k])/(order-i);
    }
    CVlen -= cvdim;
  }
  while(order < ord0)
    ON_IncreaseBezierDegree(dim,true,order++,cv_stride,cv);
  return false;
}